

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 countLookasideSlots(LookasideSlot *p)

{
  u32 local_14;
  LookasideSlot *pLStack_10;
  u32 cnt;
  LookasideSlot *p_local;
  
  local_14 = 0;
  for (pLStack_10 = p; pLStack_10 != (LookasideSlot *)0x0; pLStack_10 = pLStack_10->pNext) {
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

static u32 countLookasideSlots(LookasideSlot *p){
  u32 cnt = 0;
  while( p ){
    p = p->pNext;
    cnt++;
  }
  return cnt;
}